

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clickrem.c
# Opt level: O1

void dumb_remove_clicks_array
               (int n,DUMB_CLICK_REMOVER **cr,sample_t_conflict **samples,int32 length,
               double halflife)

{
  DUMB_CLICK_REMOVER **ppDVar1;
  ulong uVar2;
  
  if (cr != (DUMB_CLICK_REMOVER **)0x0) {
    if (n >> 1 < 1) {
      uVar2 = 0;
    }
    else {
      ppDVar1 = cr + 1;
      uVar2 = 0;
      do {
        dumb_remove_clicks(ppDVar1[-1],samples[uVar2],length,2,halflife);
        dumb_remove_clicks(*ppDVar1,samples[uVar2] + 1,length,2,halflife);
        uVar2 = uVar2 + 1;
        ppDVar1 = ppDVar1 + 2;
      } while ((uint)(n >> 1) != uVar2);
    }
    if ((n & 1U) != 0) {
      dumb_remove_clicks(cr[(int)uVar2 * 2],samples[uVar2 & 0xffffffff],length,1,halflife);
      return;
    }
  }
  return;
}

Assistant:

void DUMBEXPORT dumb_remove_clicks_array(int n, DUMB_CLICK_REMOVER **cr, sample_t **samples, int32 length, double halflife)
{
	if (cr) {
		int i;
		for (i = 0; i < n >> 1; i++) {
			dumb_remove_clicks(cr[i << 1], samples[i], length, 2, halflife);
			dumb_remove_clicks(cr[(i << 1) + 1], samples[i] + 1, length, 2, halflife);
		}
		if (n & 1)
			dumb_remove_clicks(cr[i << 1], samples[i], length, 1, halflife);
	}
}